

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Map(Map *this,int id,World *world)

{
  bool bVar1;
  TimeEvent *this_00;
  TimeEvent *event;
  World *world_local;
  int id_local;
  Map *this_local;
  
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::list(&this->characters);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector(&this->npcs);
  std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::vector
            (&this->chests);
  std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::list
            (&this->items);
  std::vector<Map_Tile,_std::allocator<Map_Tile>_>::vector(&this->tiles);
  std::__cxx11::string::string((string *)&this->jukebox_player);
  world_local._4_2_ = (short)id;
  this->id = world_local._4_2_;
  this->world = world;
  this->exists = false;
  this->jukebox_protect = 0.0;
  this->arena = (Arena *)0x0;
  this->evacuate_lock = false;
  this->has_timed_spikes = false;
  LoadArena(this);
  Load(this);
  bVar1 = std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::
          empty(&this->chests);
  if (!bVar1) {
    this_00 = (TimeEvent *)operator_new(0x30);
    TimeEvent::TimeEvent(this_00,map_spawn_chests,this,60.0,-1);
    Timer::Register(&this->world->timer,this_00);
  }
  return;
}

Assistant:

Map::Map(int id, World *world)
{
	this->id = id;
	this->world = world;
	this->exists = false;
	this->jukebox_protect = 0.0;
	this->arena = 0;
	this->evacuate_lock = false;
	this->has_timed_spikes = false;

	this->LoadArena();

	this->Load();

	if (!this->chests.empty())
	{
		TimeEvent *event = new TimeEvent(map_spawn_chests, this, 60.0, Timer::FOREVER);
		this->world->timer.Register(event);
	}
}